

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  int *piVar1;
  Btree *p;
  BtCursor *pBVar2;
  BtCursor *pBVar3;
  BtCursor *pBVar4;
  short sVar5;
  int in_EAX;
  int extraout_EAX;
  BtShared *pBVar6;
  BtCursor *pBVar7;
  long lVar8;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBVar2 = (BtCursor *)pCur->pBt;
    sqlite3BtreeEnter(p);
    sqlite3_free(pCur->pKey);
    pCur->pKey = (void *)0x0;
    pCur->eState = '\0';
    pBVar3 = pCur->pNext;
    pBVar4 = pCur->pPrev;
    pBVar7 = pBVar4;
    if (pBVar4 == (BtCursor *)0x0) {
      pBVar7 = pBVar2;
    }
    pBVar7->pNext = pBVar3;
    if (pBVar3 != (BtCursor *)0x0) {
      pBVar3->pPrev = pBVar4;
    }
    sVar5 = pCur->iPage;
    if (-1 < sVar5) {
      lVar8 = -1;
      do {
        if (pCur->apPage[lVar8 + 1] != (MemPage *)0x0) {
          sqlite3PagerUnref(pCur->apPage[lVar8 + 1]->pDbPage);
          sVar5 = pCur->iPage;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < sVar5);
    }
    if ((*(char *)((long)&pBVar2->pKeyInfo + 4) == '\0') && (pBVar2->pPrev != (BtCursor *)0x0)) {
      sqlite3PagerUnref((DbPage *)pBVar2->pPrev->pKey);
      pBVar2->pPrev = (BtCursor *)0x0;
    }
    sqlite3_free(pCur->aOverflow);
    pCur->aOverflow = (Pgno *)0x0;
    in_EAX = extraout_EAX;
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        pBVar6 = p->pBt;
        if (pBVar6->mutex != (sqlite3_mutex *)0x0) {
          pBVar6 = (BtShared *)(*sqlite3Config.mutex.xMutexLeave)(pBVar6->mutex);
        }
        in_EAX = (int)pBVar6;
        p->locked = '\0';
      }
    }
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    int i;
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    sqlite3BtreeClearCursor(pCur);
    if( pCur->pPrev ){
      pCur->pPrev->pNext = pCur->pNext;
    }else{
      pBt->pCursor = pCur->pNext;
    }
    if( pCur->pNext ){
      pCur->pNext->pPrev = pCur->pPrev;
    }
    for(i=0; i<=pCur->iPage; i++){
      releasePage(pCur->apPage[i]);
    }
    unlockBtreeIfUnused(pBt);
    invalidateOverflowCache(pCur);
    /* sqlite3_free(pCur); */
    sqlite3BtreeLeave(pBtree);
  }
  return SQLITE_OK;
}